

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

bool __thiscall QTextStream::readLineInto(QTextStream *this,QString *line,qint64 maxlen)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  bool bVar1;
  long in_FS_OFFSET;
  qsizetype length;
  QChar *readPtr;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->string == (QString *)0x0) &&
     ((this_00._M_head_impl)->device == (QIODevice *)0x0)) {
    if ((line == (QString *)0x0) || ((line->d).ptr == (char16_t *)0x0)) {
      bVar1 = false;
      goto LAB_00116fc2;
    }
    bVar1 = false;
  }
  else {
    readPtr = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QTextStreamPrivate::scan(this_00._M_head_impl,&readPtr,&length,maxlen,EndOfLine);
    if (bVar1) {
      if (line != (QString *)0x0) {
        QString::setUnicode(line,readPtr,length);
      }
      QTextStreamPrivate::consumeLastToken(this_00._M_head_impl);
      goto LAB_00116fc2;
    }
    if ((line == (QString *)0x0) || ((line->d).ptr == (char16_t *)0x0)) goto LAB_00116fc2;
  }
  QString::resize(line,0);
LAB_00116fc2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QTextStream::readLineInto(QString *line, qint64 maxlen)
{
    Q_D(QTextStream);
    // keep in sync with CHECK_VALID_STREAM
    if (!d->string && !d->device) {
        qWarning("QTextStream: No device");
        if (line && !line->isNull())
            line->resize(0);
        return false;
    }

    const QChar *readPtr;
    qsizetype length;
    if (!d->scan(&readPtr, &length, qsizetype(maxlen), QTextStreamPrivate::EndOfLine)) {
        if (line && !line->isNull())
            line->resize(0);
        return false;
    }

    if (Q_LIKELY(line))
        line->setUnicode(readPtr, length);
    d->consumeLastToken();
    return true;
}